

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ulong *puVar1;
  string *outFileName;
  string *outFolder;
  ulong uVar2;
  pointer ppVar3;
  int iVar4;
  int iVar5;
  iterator __begin1;
  time_t tVar6;
  long *plVar7;
  ostream *poVar8;
  long lVar9;
  pointer *pppVar10;
  pointer pvVar11;
  undefined8 extraout_RAX;
  iterator __end1;
  long *plVar12;
  long lVar13;
  iterator __begin2;
  ulong *puVar14;
  pointer ppVar15;
  long lVar16;
  char *pcVar17;
  Graph *pGVar18;
  ulong uVar19;
  pointer ppVar20;
  _Alloc_hider _Var21;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  ulong *puVar22;
  pointer puVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  long lVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  float fVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  double extraout_XMM1_Qa_01;
  double extraout_XMM1_Qa_02;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double feps;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  Graph graph;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec_degree;
  vector<double,_std::allocator<double>_> budget_list;
  string infilename;
  Graph resgraph;
  TArgument Arg;
  TAlg tAlg;
  ofstream outputFile;
  Graph local_8f0;
  double local_8d8;
  double local_8d0;
  char local_8c1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_8c0;
  double local_8a8;
  double dStack_8a0;
  vector<double,_std::allocator<double>_> local_898;
  double local_880;
  long *local_878;
  long local_870;
  long local_868;
  long lStack_860;
  Graph local_858;
  undefined1 local_840 [248];
  _Alloc_hider local_748;
  size_type local_740;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  undefined1 local_488 [224];
  CascadeModel local_3a8;
  CascadeModel local_310;
  TResult local_2b8;
  long *local_230;
  filebuf local_228 [8];
  long local_220 [29];
  ios_base local_138 [264];
  
  tVar6 = time((time_t *)0x0);
  dsfmt_chk_init_gen_rand(&dsfmt_global_data,(uint32_t)tVar6,0x4de1);
  Argument::Argument((Argument *)local_840,argc,argv);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_840._152_8_,(pointer)(local_840._152_8_ + local_840._160_8_)
            );
  std::__cxx11::string::append((char *)&local_230);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_230,local_840._88_8_);
  local_878 = &local_868;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_868 = *plVar12;
    lStack_860 = plVar7[3];
  }
  else {
    local_868 = *plVar12;
    local_878 = (long *)*plVar7;
  }
  local_870 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  if ((local_840._0_4_ & 0xfffffffd) == 0) {
    local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_608,local_878,local_870 + (long)local_878);
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_628,local_840._120_8_,
               (pointer)(local_840._120_8_ + local_840._128_8_));
    GraphBase::format_graph(&local_608,&local_628);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
    }
    if (local_840._0_4_ == 0) {
      iVar4 = 1;
      goto LAB_00114e90;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---The Begin of ",0x10);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_728._M_dataplus._M_p,local_728._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"---\n",4);
  lVar9 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Format Graph Successfully",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_648,local_878,local_870 + (long)local_878);
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_668,local_748._M_p,local_748._M_p + local_740);
  GraphBase::load_graph(&local_8f0,&local_648,false,&local_668,(float)local_840._16_4_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_688,local_878,local_870 + (long)local_878);
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6a8,local_748._M_p,local_748._M_p + local_740);
  GraphBase::load_graph(&local_858,&local_688,true,&local_6a8,(float)local_840._16_4_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Load Graph Successfully",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_230 = (long *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_8c0,
             ((long)local_8f0.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_8f0.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (value_type_conflict2 *)&local_230,(allocator_type *)local_488);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488,
                 "degree_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_840 + 0x58));
  std::ofstream::ofstream(&local_230,(string *)local_488,_S_out);
  if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
    operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
  }
  if ((long)local_8f0.
            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_8f0.
            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    lVar25 = 0;
  }
  else {
    lVar13 = ((long)local_8f0.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_8f0.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    pppVar10 = &((local_8f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    lVar25 = 0;
    lVar16 = 0;
    do {
      uVar19 = (long)*pppVar10 - (long)((_Vector_impl_data *)(pppVar10 + -1))->_M_start >> 3;
      local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar16] = uVar19;
      lVar25 = lVar25 + uVar19;
      lVar16 = lVar16 + 1;
      pppVar10 = pppVar10 + 3;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar16);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# Node: ",8);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# Edge: ",8);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ave degree: ",0xc);
  auVar31._8_4_ = (int)((ulong)lVar25 >> 0x20);
  auVar31._0_8_ = lVar25;
  auVar31._12_4_ = 0x45300000;
  lVar13 = ((long)local_8f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_8f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  auVar32._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar32._0_8_ = lVar13;
  auVar32._12_4_ = 0x45300000;
  feps = (auVar32._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
  poVar8 = std::ostream::_M_insert<double>
                     (((auVar31._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0)) / feps);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ofstream::close();
  puVar23 = local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar13 = (long)local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar19 = lVar13 >> 3;
    lVar25 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar25 == 0; lVar25 = lVar25 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
              (local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar13 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (puVar23,local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      puVar22 = puVar23 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (puVar23,puVar22);
      for (; puVar22 !=
             local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish; puVar22 = puVar22 + 1) {
        uVar2 = *puVar22;
        uVar19 = puVar22[-1];
        puVar14 = puVar22;
        while (uVar2 < uVar19) {
          *puVar14 = uVar19;
          puVar1 = puVar14 + -2;
          puVar14 = puVar14 + -1;
          uVar19 = *puVar1;
        }
        *puVar14 = uVar2;
      }
    }
  }
  local_488._0_8_ = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_898,
             ((long)local_8f0.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_8f0.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (value_type_conflict4 *)local_488,(allocator_type *)&local_2b8);
  lVar25 = ((long)local_8f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_8f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  auVar33._8_4_ = (int)((ulong)lVar25 >> 0x20);
  auVar33._0_8_ = lVar25;
  auVar33._12_4_ = 0x45300000;
  dVar34 = auVar33._8_8_ - 1.9342813113834067e+25;
  dVar28 = dVar34 + ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
  if (local_8f0.
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_8f0.
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pppVar10 = &((local_8f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    lVar13 = 0;
    feps = 0.01;
    do {
      lVar16 = (long)*pppVar10 - (long)((_Vector_impl_data *)(pppVar10 + -1))->_M_start;
      uVar19 = lVar16 >> 3;
      iVar4 = (int)(lVar16 >> 0x23);
      if (local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[(int)((double)local_840._56_8_ * dVar28)] < uVar19) {
        auVar35._8_4_ = iVar4;
        auVar35._0_8_ = uVar19;
        auVar35._12_4_ = 0x45300000;
        dVar37 = ((auVar35._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0)) * 0.01;
      }
      else {
        auVar36._8_4_ = iVar4;
        auVar36._0_8_ = uVar19;
        auVar36._12_4_ = 0x45300000;
        dVar37 = ((auVar36._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0)) *
                 (double)local_840._72_8_ * 10.0;
      }
      local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar13] = dVar37;
      lVar13 = lVar13 + 1;
      pppVar10 = pppVar10 + 3;
    } while (lVar25 + (ulong)(lVar25 == 0) != lVar13);
  }
  dStack_8a0 = (double)(int)dVar34;
  local_8a8 = (double)(int)(dVar28 * (double)local_840._56_8_) * (double)local_840._64_8_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.3 percent degree: ",0x14);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.5 percent degree: ",0x14);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.7 percent degree: ",0x14);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.9 percent degree: ",0x14);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.95 percent degree: ",0x15);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.99 percent degree: ",0x15);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.999 percent degree: ",0x16);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.9999 percent degree: ",0x17);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.99995 percent degree: ",0x18);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.99999 percent degree: ",0x18);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.999999 percent degree: ",0x19);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.9999999 percent degree: ",0x1a);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"0.99999999 percent degree: ",0x1b);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# nodes: ",9);
  lVar25 = ((long)local_8f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_8f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  auVar29._8_4_ = (int)((ulong)lVar25 >> 0x20);
  auVar29._0_8_ = lVar25;
  auVar29._12_4_ = 0x45300000;
  plVar7 = (long *)std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (int)(((auVar29._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0))
                                   * (double)local_840._56_8_));
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"real budget: ",0xd);
  poVar8 = std::ostream::_M_insert<double>(local_8a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_840 + 0xd8);
  iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf);
  if ((((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0))
      || (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
     (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) {
    iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf);
    if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0))
    {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"start CELF algorithm",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      lVar9 = std::chrono::_V2::system_clock::now();
      CELF::celfalgo((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488,&local_8f0,
                     (double)local_840._24_8_,&local_898,local_840._80_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Time used (sec): ",0x11);
      lVar25 = std::chrono::_V2::system_clock::now();
      poVar8 = std::ostream::_M_insert<double>((double)(lVar25 - lVar9) / 1000000000.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      for (puVar23 = (pointer)local_488._0_8_; puVar23 != (pointer)local_488._8_8_;
          puVar23 = puVar23 + 1) {
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Seed Size: ",0xb);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    else {
      iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf);
      if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 != 0)
         ) goto LAB_00114e11;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"start CELF++ algorithm",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      lVar9 = std::chrono::_V2::system_clock::now();
      CELFPP::celfppalgo((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488,
                         &local_8f0,(double)local_840._24_8_,&local_898,local_840._80_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Time used (sec): ",0x11);
      lVar25 = std::chrono::_V2::system_clock::now();
      poVar8 = std::ostream::_M_insert<double>((double)(lVar25 - lVar9) / 1000000000.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      for (puVar23 = (pointer)local_488._0_8_; puVar23 != (pointer)local_488._8_8_;
          puVar23 = puVar23 + 1) {
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Seed Size: ",0xb);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    if ((pointer)local_488._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_488._0_8_,local_488._16_8_ - local_488._0_8_);
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf);
    if (((((((iVar4 == 0) ||
            (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
           (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
          ((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
           (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)))) ||
         ((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
          ((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
           (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)))))) ||
        ((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
         ((((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
            (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
           (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
          (((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
            (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
           ((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
            ((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
             (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0))))))))))))
       || (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) {
      pvVar11 = local_858.
                super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_840._80_4_ == LT) {
        for (; pvVar11 !=
               local_858.
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; pvVar11 = pvVar11 + 1) {
          ppVar15 = (pvVar11->
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          ppVar3 = (pvVar11->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar15 != ppVar3) {
            fVar27 = 0.0;
            ppVar20 = ppVar15;
            do {
              fVar27 = fVar27 + ppVar20->second;
              ppVar20->second = fVar27;
              ppVar20 = ppVar20 + 1;
            } while (ppVar20 != ppVar3);
            do {
              ppVar15->second = ppVar15->second / fVar27;
              ppVar15 = ppVar15 + 1;
            } while (ppVar15 != ppVar3);
          }
        }
      }
      local_2b8.__RunningTime = -1.0;
      local_2b8.__Influence = -1.0;
      local_2b8.__InfluenceOriginal = -1.0;
      local_2b8.__Approx = -1.0;
      local_2b8.__SeedSize = 0;
      local_2b8.__RRsetsSize = 0;
      local_2b8.__BoundMin_inf = 0.0;
      local_2b8.__BoundMin_inf_cost = 0.0;
      local_2b8.__VecSeed.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.__VecSeed.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.__VecSeed.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.__VecSeed_inf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.__VecSeed_inf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.__VecSeed_inf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.__VecSeed_inf_cost.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.__VecSeed_inf_cost.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.__VecSeed_inf_cost.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Alg::Alg((Alg *)local_488,&local_858,&local_2b8);
      local_3a8 = local_840._80_4_;
      local_310 = local_840._80_4_;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ==>Graph loaded for RIS! total time used (sec): ",0x32);
      lVar25 = std::chrono::_V2::system_clock::now();
      poVar8 = std::ostream::_M_insert<double>((double)(lVar25 - lVar9) / 1000000000.0);
      local_8c1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_8c1,1);
      pcVar17 = local_840 + 0x78;
      iVar5 = std::__cxx11::string::compare(pcVar17);
      iVar4 = 0;
      if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare(pcVar17), iVar4 = 0, iVar5 != 0)) {
        iVar4 = std::__cxx11::string::compare(pcVar17);
        if (iVar4 != 0) {
          iVar5 = std::__cxx11::string::compare(pcVar17);
          iVar4 = 2;
          if (iVar5 != 0) goto LAB_00114893;
        }
        iVar4 = 1;
      }
LAB_00114893:
      local_8d8 = (double)local_840._48_8_;
      if ((double)local_840._48_8_ < 0.0) {
        lVar9 = ((long)local_858.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_858.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        auVar30._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar30._0_8_ = lVar9;
        auVar30._12_4_ = 0x45300000;
        local_8d8 = 1.0 / ((auVar30._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
      }
      iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar5 == 0)
         ) {
LAB_00114b47:
        Alg::opimc((Alg *)local_488,local_840._4_4_,(double)local_840._32_8_,local_8d8,iVar4);
      }
      else {
        iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf);
        if ((iVar5 == 0) ||
           (iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar5 == 0)) {
          Alg::opim((Alg *)local_488,local_840._4_4_,local_840._8_8_,local_8d8,iVar4);
        }
        else {
          iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf);
          if ((iVar5 == 0) ||
             (iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar5 == 0)) {
            pcVar17 = "OPIM-B";
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OPIM-B",6);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            Alg::opimb((Alg *)local_488,(Graph *)pcVar17,local_8a8,&local_898,
                       (double)local_840._32_8_,local_8d8,iVar4);
          }
          else {
            iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf);
            if ((iVar5 == 0) ||
               (iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar5 == 0)) {
              pcVar17 = "OPIM-B-NAIVE";
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"OPIM-B-NAIVE",0xc);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              Alg::opimb_naive((Alg *)local_488,(Graph *)pcVar17,local_8a8,&local_898,
                               (double)local_840._32_8_,local_8d8,0);
            }
            else {
              iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf);
              if ((iVar5 == 0) ||
                 (iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar5 == 0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"OPIM-B-FAST-END",0xf);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                if (local_840._80_4_ == LT) {
                  iVar5 = std::__cxx11::string::compare((char *)(local_840 + 0x58));
                  if (iVar5 == 0) {
                    local_8d0 = (double)local_840._32_8_;
                    local_880 = (double)local_840._40_8_;
                    paVar24 = &local_5a8.field_2;
                    local_5a8._M_dataplus._M_p = (pointer)paVar24;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"LT","");
                    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_6c8,local_840._88_8_,
                               (pointer)(local_840._88_8_ + local_840._96_8_));
                    Alg::opimb_fast_end((Alg *)local_488,(Graph *)local_840._88_8_,local_8a8,
                                        &local_898,local_8d0,local_880,local_8d8,&local_5a8,
                                        &local_6c8,1);
                    _Var21._M_p = local_5a8._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
                      operator_delete(local_6c8._M_dataplus._M_p,
                                      local_6c8.field_2._M_allocated_capacity + 1);
                      _Var21._M_p = local_5a8._M_dataplus._M_p;
                    }
                  }
                  else {
                    if (local_840._80_4_ != LT) goto LAB_00115006;
                    local_8d0 = (double)local_840._32_8_;
                    local_880 = (double)local_840._40_8_;
                    paVar24 = &local_5c8.field_2;
                    local_5c8._M_dataplus._M_p = (pointer)paVar24;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"LT","");
                    local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_6e8,local_840._88_8_,
                               (pointer)(local_840._88_8_ + local_840._96_8_));
                    Alg::opimb_fast_end((Alg *)local_488,(Graph *)local_840._88_8_,local_8a8,
                                        &local_898,local_8d0,local_880,local_8d8,&local_5c8,
                                        &local_6e8,iVar4);
                    _Var21._M_p = local_5c8._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
                      operator_delete(local_6e8._M_dataplus._M_p,
                                      local_6e8.field_2._M_allocated_capacity + 1);
                      _Var21._M_p = local_5c8._M_dataplus._M_p;
                    }
                  }
                }
                else {
LAB_00115006:
                  local_8d0 = (double)local_840._32_8_;
                  local_880 = (double)local_840._40_8_;
                  paVar24 = &local_5e8.field_2;
                  local_5e8._M_dataplus._M_p = (pointer)paVar24;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"IC","");
                  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_708,local_840._88_8_,
                             (pointer)(local_840._88_8_ + local_840._96_8_));
                  Alg::opimb_fast_end((Alg *)local_488,(Graph *)local_840._88_8_,local_8a8,
                                      &local_898,local_8d0,local_880,local_8d8,&local_5e8,&local_708
                                      ,iVar4);
                  _Var21._M_p = local_5e8._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_708._M_dataplus._M_p != &local_708.field_2) {
                    operator_delete(local_708._M_dataplus._M_p,
                                    local_708.field_2._M_allocated_capacity + 1);
                    _Var21._M_p = local_5e8._M_dataplus._M_p;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var21._M_p != paVar24) {
                  operator_delete(_Var21._M_p,paVar24->_M_allocated_capacity + 1);
                }
              }
              else {
                iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf);
                if ((iVar5 == 0) ||
                   (iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar5 == 0)) {
                  pcVar17 = "OPIM-B-APPROX";
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"OPIM-B-APPROX",0xd);
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  Alg::opimb_approx((Alg *)local_488,(Graph *)pcVar17,local_8a8,&local_898,
                                    (double)local_840._32_8_,local_8d8,iVar4);
                }
                else {
                  iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf);
                  if ((iVar5 != 0) &&
                     (iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar5 != 0)) {
                    iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf);
                    dVar28 = extraout_XMM1_Qa;
                    if ((iVar5 == 0) ||
                       (iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf),
                       dVar28 = extraout_XMM1_Qa_00, iVar5 == 0)) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"OPIM-APPROX",0xb);
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                      local_8d0 = (double)local_840._40_8_;
                      if (local_840._80_4_ != LT) goto LAB_001153cb;
                      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"LT","");
                      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                      pGVar18 = (Graph *)local_840._88_8_;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_4c8,local_840._88_8_,
                                 (pointer)(local_840._88_8_ + local_840._96_8_));
                      feps = local_8d0;
                      Alg::opim_approx((Alg *)local_488,pGVar18,local_8a8,&local_898,dVar28,
                                       local_8d0,local_8d8,&local_4a8,&local_4c8,iVar4);
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf);
                      dVar28 = extraout_XMM1_Qa_01;
                      if ((iVar5 != 0) &&
                         (iVar5 = std::__cxx11::string::compare(paVar26->_M_local_buf),
                         dVar28 = extraout_XMM1_Qa_02, iVar5 != 0)) goto LAB_00114c36;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"OPIM-APPROX-FAST",0x10);
                      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                      if (local_840._80_4_ == LT) {
                        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_528,"LT","");
                        paVar26 = &local_548.field_2;
                        local_548._M_dataplus._M_p = (pointer)paVar26;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_548,local_840._88_8_,
                                   (pointer)(local_840._88_8_ + local_840._96_8_));
                        Alg::opim_approx_fast
                                  ((Alg *)local_488,(Graph *)local_840._88_8_,local_8a8,&local_898,
                                   dVar28,feps,local_8d8,&local_528,&local_548,iVar4);
                        goto LAB_00114b47;
                      }
                    }
                    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"IC","");
                    local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
                    pGVar18 = (Graph *)local_840._88_8_;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_588,local_840._88_8_,
                               (pointer)(local_840._88_8_ + local_840._96_8_));
                    Alg::opim_approx_fast
                              ((Alg *)local_488,pGVar18,local_8a8,&local_898,dVar28,feps,local_8d8,
                               &local_568,&local_588,iVar4);
LAB_001153cb:
                    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"IC","");
                    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_508,local_840._88_8_,
                               (pointer)(local_840._88_8_ + local_840._96_8_));
                    Alg::opim_approx((Alg *)local_488,(Graph *)local_840._88_8_,local_8a8,&local_898
                                     ,dVar28,local_8d0,local_8d8,&local_4e8,&local_508,iVar4);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_508._M_dataplus._M_p != &local_508.field_2) {
                      operator_delete(local_508._M_dataplus._M_p,
                                      local_508.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                      operator_delete(local_4e8._M_dataplus._M_p,
                                      local_4e8.field_2._M_allocated_capacity + 1);
                    }
                    Alg::~Alg((Alg *)local_488);
                    ResultInfo::~ResultInfo(&local_2b8);
                    if (local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_898.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_898.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_898.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::ofstream::~ofstream(&local_230);
                    if (local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start != (ulong *)0x0) {
                      operator_delete(local_8c0.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_8c0.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_8c0.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ::~vector(&local_858);
                    std::
                    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ::~vector(&local_8f0);
                    if (local_878 != &local_868) {
                      operator_delete(local_878,local_868 + 1);
                    }
                    Argument::~Argument((Argument *)local_840);
                    _Unwind_Resume(extraout_RAX);
                  }
                  pcVar17 = "OPIM-B-FAST-APPROX";
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"OPIM-B-FAST-APPROX",0x12);
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                  Alg::opimb_fast_approx
                            ((Alg *)local_488,(Graph *)pcVar17,local_8a8,&local_898,
                             (double)local_840._32_8_,(double)local_840._40_8_,local_8d8,iVar4);
                }
              }
            }
          }
        }
      }
LAB_00114c36:
      outFileName = (string *)(local_840 + 0x118);
      outFolder = (string *)(local_840 + 0xb8);
      IOcontroller::write_result(outFileName,&local_2b8,outFolder);
      IOcontroller::write_order_seeds(outFileName,&local_2b8,outFolder,&local_8f0);
      iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf);
      if ((((iVar4 == 0) ||
           (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
          (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
         (((((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
             (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
            ((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
             ((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
              (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)))))) ||
           (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
          ((((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
             (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
            (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)) ||
           ((iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0 ||
            (iVar4 = std::__cxx11::string::compare(paVar26->_M_local_buf), iVar4 == 0)))))))) {
        IOcontroller::write_budget_order_seeds(outFileName,&local_2b8,outFolder,&local_8f0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"---The End of ",0xe)
      ;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_728._M_dataplus._M_p,
                          local_728._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"---\n",4);
      Alg::~Alg((Alg *)local_488);
      ResultInfo::~ResultInfo(&local_2b8);
    }
  }
LAB_00114e11:
  if (local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + _VTT[-3] + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_8c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_8c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(&local_858);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(&local_8f0);
  iVar4 = 0;
LAB_00114e90:
  if (local_878 != &local_868) {
    operator_delete(local_878,local_868 + 1);
  }
  Argument::~Argument((Argument *)local_840);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
    // Randomize the seed for generating random numbers
    dsfmt_gv_init_gen_rand(static_cast<uint32_t>(time(nullptr)));
    const TArgument Arg(argc, argv);
    const string infilename = Arg._dir + "/" + Arg._graphname;
    if (Arg._func == 0 || Arg._func == 2) {
        // Format the graph
        GraphBase::format_graph(infilename, Arg._mode);
        if (Arg._func == 0) {
            return 1;
        }
    }

    cout << "---The Begin of " << Arg._outFileName << "---\n";
    Timer mainTimer("main");
    cout << "Format Graph Successfully" << endl;

    // Load the reverse graph
    Graph graph = GraphBase::load_graph(infilename, false, Arg._probDist, Arg._probEdge);
    Graph resgraph = GraphBase::load_graph(infilename, true, Arg._probDist, Arg._probEdge);
    cout << "Load Graph Successfully" << endl;

    vector<size_t> vec_degree(graph.size(), 0);
    std::ofstream outputFile("degree_" + Arg._graphname);
    size_t count_degree = 0;
    for (size_t i = 0; i < graph.size(); i++) {
        vec_degree[i] = graph[i].size();
        count_degree = count_degree + graph[i].size();
    }
    std::cout << "# Node: " << graph.size() << std::endl;
    std::cout << "# Edge: " << count_degree << std::endl;
    std::cout << "Ave degree: " << (double) count_degree / graph.size() << std::endl;
    outputFile.close();
    sort(vec_degree.begin(), vec_degree.end(), [](auto & left, auto & right){
        return left < right;
    });

    // Assign budget for each node
    vector<double> budget_list(graph.size(), 0);
    default_random_engine engine;
    uniform_int_distribution<unsigned> u(5, 10);
    for (size_t i = 0; i < graph.size(); i++) {
        if (graph[i].size() > vec_degree[int(Arg._percent * graph.size())]) {
            budget_list[i] = (double) 10 * 0.001 * graph[i].size();
//            budget_list[i] = (double) u(engine) * 0.001 * graph[i].size();
        }
        else {
            budget_list[i] = (double) 10 * Arg._normalpha * graph[i].size();
//            budget_list[i] = (double) u(engine) * Arg._normalpha * graph[i].size();
        }
    }
    double real_budget = (double) Arg._budpercent * int(Arg._percent * graph.size());
//    double real_budget = (double) Arg._budpercent * int(graph.size());
    std::cout << "0.3 percent degree: " << vec_degree[int(0.3 * graph.size())] << std::endl;
    std::cout << "0.5 percent degree: " << vec_degree[int(0.5 * graph.size())] << std::endl;
    std::cout << "0.7 percent degree: " << vec_degree[int(0.7 * graph.size())] << std::endl;
    std::cout << "0.9 percent degree: " << vec_degree[int(0.9 * graph.size())] << std::endl;
    std::cout << "0.95 percent degree: " << vec_degree[int(0.95 * graph.size())] << std::endl;
    std::cout << "0.99 percent degree: " << vec_degree[int(0.99 * graph.size())] << std::endl;
    std::cout << "0.999 percent degree: " << vec_degree[int(0.999 * graph.size())] << std::endl;
    std::cout << "0.9999 percent degree: " << vec_degree[int(0.9999 * graph.size())] << std::endl;
    std::cout << "0.99995 percent degree: " << vec_degree[int(0.99995 * graph.size())] << std::endl;
    std::cout << "0.99999 percent degree: " << vec_degree[int(0.99999 * graph.size())] << std::endl;
    std::cout << "0.999999 percent degree: " << vec_degree[int(0.999999 * graph.size())] << std::endl;
    std::cout << "0.9999999 percent degree: " << vec_degree[int(0.9999999 * graph.size())] << std::endl;
    std::cout << "0.99999999 percent degree: " << vec_degree[int(0.99999999 * graph.size())] << std::endl;
    std::cout << "# nodes: " << int(Arg._percent * graph.size()) << std::endl;
    std::cout << "real budget: " << real_budget << std::endl;

    if (Arg._algName == "CELF" || Arg._algName == "celf" ||
        Arg._algName == "CELF++" || Arg._algName == "celf++") {
        if (Arg._algName == "CELF" || Arg._algName == "celf") {
            cout << "start CELF algorithm" << endl;
            Timer EvalTimer;
            vector<size_t> res = CELF::celfalgo(graph, Arg._budget, budget_list, Arg._model);
            cout << "Time used (sec): " << EvalTimer.get_total_time() << endl;
            for(unsigned int re : res) {
                cout << re << " ";
            }
            cout << endl;
            cout << "Seed Size: " << res.size() << endl;
        }
        else if (Arg._algName == "CELF++" || Arg._algName == "celf++") {
            cout << "start CELF++ algorithm" << endl;
            Timer EvalTimer;
            vector<size_t> res = CELFPP::celfppalgo(graph, Arg._budget, budget_list, Arg._model);
            cout << "Time used (sec): " << EvalTimer.get_total_time() << endl;
            for(unsigned int re : res) {
                cout << re << " ";
            }
            cout << endl;
            cout << "Seed Size: " << res.size() << endl;
        }
    }
    // IMAGE == opim-b-fe IMAGE-BR = opim-b
    else if (Arg._algName == "opim-c" || Arg._algName == "OPIM-C" ||
             Arg._algName == "opim" || Arg._algName == "OPIM" ||
             Arg._algName == "opim-b" || Arg._algName == "OPIM-B" ||
             Arg._algName == "opim-b-n" || Arg._algName == "OPIM-B-N" ||
             Arg._algName == "opim-b-fe" || Arg._algName == "OPIM-B-FE" ||
             Arg._algName == "opim-ba" || Arg._algName == "OPIM-BA" ||
             Arg._algName == "opim-b-fa" || Arg._algName == "OPIM-B-FA" ||
             Arg._algName == "opim-a" || Arg._algName == "OPIM-A" ||
             Arg._algName == "opim-a-f" || Arg._algName == "OPIM-A-F") {
        if (Arg._model == LT) {
            // Normalize the propagation probabilities in accumulation format for
            // LT cascade model for quickly generating RR sets
            to_normal_accum_prob(resgraph);
        }
        // Initialize a result object to record the results
        TResult tRes;
        TAlg tAlg(resgraph, tRes);
        tAlg.set_cascade_model(Arg._model); // Set propagation model

        cout << "  ==>Graph loaded for RIS! total time used (sec): " << mainTimer.get_total_time() << '\n';
        int mode = 2; // Default is to use the minimum upper bound among all the rounds
        if (Arg._mode == "0" || Arg._mode == "vanilla") {
            mode = 0;
        }
        else if (Arg._mode == "1" || Arg._mode == "last") {
            mode = 1;
        }
        auto delta = Arg._delta;
        if (delta < 0) {
            delta = 1.0 / resgraph.size();
        }
        if (Arg._algName == "opim-c" || Arg._algName == "OPIM-C") {
            tAlg.opimc(Arg._seedsize, Arg._eps, delta, mode);
        }
        else if (Arg._algName == "opim" || Arg._algName == "OPIM") {
            tAlg.opim(Arg._seedsize, Arg._samplesize, delta, mode);
        }
        else if (Arg._algName == "opim-b" || Arg._algName == "OPIM-B") {
            cout << "OPIM-B" << endl;
            tAlg.opimb(graph, real_budget, budget_list, Arg._eps, delta, mode);
        }
        else if (Arg._algName == "opim-b-n" || Arg._algName == "OPIM-B-N") {
            cout << "OPIM-B-NAIVE" << endl;
            tAlg.opimb_naive(graph, real_budget, budget_list, Arg._eps, delta, 0);
        }
        else if (Arg._algName == "opim-b-fe" || Arg._algName == "OPIM-B-FE") {
            cout << "OPIM-B-FAST-END" << endl;
            if (Arg._model == LT && Arg._graphname == "twitter") {
                tAlg.opimb_fast_end(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                        Arg._graphname, 1);
            }
            else {
                if (Arg._model == LT) {
                    tAlg.opimb_fast_end(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                            Arg._graphname, mode);
                }
                else {
                    tAlg.opimb_fast_end(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "IC",
                            Arg._graphname, mode);
                }
            }
        }
        else if (Arg._algName == "opim-ba" || Arg._algName == "OPIM-BA") {
            cout << "OPIM-B-APPROX" << endl;
            tAlg.opimb_approx(graph, real_budget, budget_list, Arg._eps, delta, mode);
        }
        else if (Arg._algName == "opim-b-fa" || Arg._algName == "OPIM-B-FA") {
            cout << "OPIM-B-FAST-APPROX" << endl;
            tAlg.opimb_fast_approx(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, mode);
        }
        else if (Arg._algName == "opim-a" || Arg._algName == "OPIM-A") {
            cout << "OPIM-APPROX" << endl;
            if (Arg._model == LT) {
                tAlg.opim_approx(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                                 Arg._graphname, mode);
            }
            else {
                tAlg.opim_approx(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "IC",
                                 Arg._graphname, mode);
            }

        }
        else if (Arg._algName == "opim-a-f" || Arg._algName == "OPIM-A-F") {
            cout << "OPIM-APPROX-FAST" << endl;
            if (Arg._model == LT) {
                tAlg.opim_approx_fast(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                        Arg._graphname, mode);
            }
            else {
                tAlg.opim_approx_fast(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "IC",
                        Arg._graphname, mode);
            }
        }
        TIO::write_result(Arg._outFileName, tRes, Arg._resultFolder);
        TIO::write_order_seeds(Arg._outFileName, tRes, Arg._resultFolder, graph);
        if (Arg._algName == "opim-b" || Arg._algName == "OPIM-B" ||
            Arg._algName == "opim-b-n" || Arg._algName == "OPIM-B-N" ||
            Arg._algName == "opim-b-fe" || Arg._algName == "OPIM-B-FE" ||
            Arg._algName == "opim-ba" || Arg._algName == "OPIM-BA" ||
            Arg._algName == "opim-b-fa" || Arg._algName == "OPIM-B-FA" ||
            Arg._algName == "opim-a" || Arg._algName == "OPIM-A" ||
            Arg._algName == "opim-a-f" || Arg._algName == "OPIM-A-F") {
            TIO::write_budget_order_seeds(Arg._outFileName, tRes, Arg._resultFolder, graph);
        }
        cout << "---The End of " << Arg._outFileName << "---\n";
    }

    return 0;
}